

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::XmlUnitTestResultPrinter::PrintXmlTestsList
               (ostream *stream,
               vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *test_suites)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer ppTVar3;
  bool bVar4;
  byte bVar5;
  ulong uVar6;
  ostream *poVar7;
  ulong uVar8;
  pointer ppTVar9;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *__range2;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  int total_tests;
  string kTestsuites;
  int local_8c;
  string local_88;
  string local_68;
  string local_48;
  undefined1 auVar12 [32];
  
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"testsuites","");
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"<",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,local_88._M_dataplus._M_p,local_88._M_string_length);
  local_8c = 0;
  ppTVar9 = (test_suites->
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>)._M_impl
            .super__Vector_impl_data._M_start;
  ppTVar3 = (test_suites->
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>)._M_impl
            .super__Vector_impl_data._M_finish;
  if (ppTVar9 != ppTVar3) {
    auVar13 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    uVar8 = 0;
    auVar14 = vpbroadcastq_avx512f();
    auVar15 = vpsrlq_avx512f(auVar14,3);
    auVar14 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar18 = auVar14;
      auVar14 = vpbroadcastq_avx512f();
      auVar14 = vporq_avx512f(auVar14,auVar13);
      uVar6 = vpcmpuq_avx512f(auVar14,auVar15,2);
      vmovdqu64_avx512f(*(undefined1 (*) [64])(ppTVar9 + uVar8));
      uVar8 = uVar8 + 8;
      auVar14 = vpgatherqq_avx512f(*(undefined8 *)(stream + 0x38));
      bVar5 = (byte)uVar6;
      auVar16._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar14._8_8_;
      auVar16._0_8_ = (ulong)(bVar5 & 1) * auVar14._0_8_;
      auVar16._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar14._16_8_;
      auVar16._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar14._24_8_;
      auVar16._32_8_ = (ulong)((byte)(uVar6 >> 4) & 1) * auVar14._32_8_;
      auVar16._40_8_ = (ulong)((byte)(uVar6 >> 5) & 1) * auVar14._40_8_;
      auVar16._48_8_ = (ulong)((byte)(uVar6 >> 6) & 1) * auVar14._48_8_;
      auVar16._56_8_ = (uVar6 >> 7) * auVar14._56_8_;
      auVar14 = vpgatherqq_avx512f(*(undefined8 *)(stream + 0x30));
      auVar17._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar14._8_8_;
      auVar17._0_8_ = (ulong)(bVar5 & 1) * auVar14._0_8_;
      auVar17._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar14._16_8_;
      auVar17._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar14._24_8_;
      auVar17._32_8_ = (ulong)((byte)(uVar6 >> 4) & 1) * auVar14._32_8_;
      auVar17._40_8_ = (ulong)((byte)(uVar6 >> 5) & 1) * auVar14._40_8_;
      auVar17._48_8_ = (ulong)((byte)(uVar6 >> 6) & 1) * auVar14._48_8_;
      auVar17._56_8_ = (uVar6 >> 7) * auVar14._56_8_;
      auVar14 = vpsubq_avx512f(auVar16,auVar17);
      auVar14 = vpsrlq_avx512f(auVar14,3);
      auVar11 = vpmovqd_avx512f(auVar14);
      auVar11 = vpaddd_avx2(auVar18._0_32_,auVar11);
      auVar14 = ZEXT3264(auVar11);
    } while ((((ulong)((long)ppTVar3 + (-8 - (long)ppTVar9)) >> 3) + 8 & 0xfffffffffffffff8) !=
             uVar8);
    auVar11 = vmovdqa32_avx512vl(auVar11);
    auVar10._0_4_ = (uint)(bVar5 & 1) * auVar11._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar18._0_4_;
    bVar4 = (bool)((byte)(uVar6 >> 1) & 1);
    auVar10._4_4_ = (uint)bVar4 * auVar11._4_4_ | (uint)!bVar4 * auVar18._4_4_;
    bVar4 = (bool)((byte)(uVar6 >> 2) & 1);
    auVar10._8_4_ = (uint)bVar4 * auVar11._8_4_ | (uint)!bVar4 * auVar18._8_4_;
    bVar4 = (bool)((byte)(uVar6 >> 3) & 1);
    auVar10._12_4_ = (uint)bVar4 * auVar11._12_4_ | (uint)!bVar4 * auVar18._12_4_;
    bVar4 = (bool)((byte)(uVar6 >> 4) & 1);
    auVar12._16_4_ = (uint)bVar4 * auVar11._16_4_ | (uint)!bVar4 * auVar18._16_4_;
    auVar12._0_16_ = auVar10;
    bVar4 = (bool)((byte)(uVar6 >> 5) & 1);
    auVar12._20_4_ = (uint)bVar4 * auVar11._20_4_ | (uint)!bVar4 * auVar18._20_4_;
    bVar4 = (bool)((byte)(uVar6 >> 6) & 1);
    auVar12._24_4_ = (uint)bVar4 * auVar11._24_4_ | (uint)!bVar4 * auVar18._24_4_;
    bVar4 = SUB81(uVar6 >> 7,0);
    auVar12._28_4_ = (uint)bVar4 * auVar11._28_4_ | (uint)!bVar4 * auVar18._28_4_;
    auVar10 = vphaddd_avx(auVar12._16_16_,auVar10);
    auVar10 = vphaddd_avx(auVar10,auVar10);
    auVar10 = vphaddd_avx(auVar10,auVar10);
    local_8c = auVar10._0_4_;
  }
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"tests","");
  StreamableToString<int>(&local_48,&local_8c);
  OutputXmlAttribute(stream,&local_88,&local_68,&local_48);
  paVar2 = &local_48.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"name","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"AllTests","");
  OutputXmlAttribute(stream,&local_88,&local_68,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,">\n",2);
  ppTVar3 = (test_suites->
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>)._M_impl
            .super__Vector_impl_data._M_finish;
  for (ppTVar9 = (test_suites->
                 super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppTVar9 != ppTVar3; ppTVar9 = ppTVar9 + 1
      ) {
    PrintXmlTestSuite(stream,*ppTVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"</",2);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_88._M_dataplus._M_p,local_88._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,">\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlTestsList(
    std::ostream* stream, const std::vector<TestSuite*>& test_suites) {
  const std::string kTestsuites = "testsuites";

  *stream << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n";
  *stream << "<" << kTestsuites;

  int total_tests = 0;
  for (auto test_suite : test_suites) {
    total_tests += test_suite->total_test_count();
  }
  OutputXmlAttribute(stream, kTestsuites, "tests",
                     StreamableToString(total_tests));
  OutputXmlAttribute(stream, kTestsuites, "name", "AllTests");
  *stream << ">\n";

  for (auto test_suite : test_suites) {
    PrintXmlTestSuite(stream, *test_suite);
  }
  *stream << "</" << kTestsuites << ">\n";
}